

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

bool slang::ast::anon_unknown_0::PortConnectionBuilder::areDimSizesEqual
               (span<const_slang::ConstantRange,_18446744073709551615UL> left,
               span<const_slang::ConstantRange,_18446744073709551615UL> right)

{
  bitwidth_t bVar1;
  bitwidth_t bVar2;
  size_type sVar3;
  size_type sVar4;
  size_t i;
  ulong local_30;
  span<const_slang::ConstantRange,_18446744073709551615UL> local_28;
  span<const_slang::ConstantRange,_18446744073709551615UL> local_18;
  bool local_1;
  
  sVar3 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::size
                    ((span<const_slang::ConstantRange,_18446744073709551615UL> *)0x4f5752);
  sVar4 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::size
                    ((span<const_slang::ConstantRange,_18446744073709551615UL> *)0x4f5761);
  if (sVar3 == sVar4) {
    for (local_30 = 0;
        sVar3 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::size
                          ((span<const_slang::ConstantRange,_18446744073709551615UL> *)0x4f5795),
        local_30 < sVar3; local_30 = local_30 + 1) {
      std::span<const_slang::ConstantRange,_18446744073709551615UL>::operator[](&local_18,local_30);
      bVar1 = ConstantRange::width((ConstantRange *)0x4f57b9);
      std::span<const_slang::ConstantRange,_18446744073709551615UL>::operator[](&local_28,local_30);
      bVar2 = ConstantRange::width((ConstantRange *)0x4f57d4);
      if (bVar1 != bVar2) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool areDimSizesEqual(std::span<const ConstantRange> left,
                                 std::span<const ConstantRange> right) {
        if (left.size() != right.size())
            return false;

        for (size_t i = 0; i < left.size(); i++) {
            if (left[i].width() != right[i].width())
                return false;
        }

        return true;
    }